

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void dump_token(SToken *t)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  
  switch(t->type) {
  case LEFT_BRACE:
    pcVar3 = "LEFT_BRACE: ";
    lVar1 = 0xc;
    break;
  case RIGHT_BRACE:
    pcVar3 = "RIGHT_BRACE: ";
    lVar1 = 0xd;
    break;
  case BOOLEAN:
    pcVar3 = "BOOLEAN: ";
    lVar1 = 9;
    break;
  case NUMBER:
    pcVar3 = "NUMBER: ";
    goto LAB_00102367;
  case STRING:
    pcVar3 = "STRING: ";
LAB_00102367:
    lVar1 = 8;
    break;
  case SEPARATOR:
    pcVar3 = "SEPARATOR: ";
    lVar1 = 0xb;
    break;
  case EQUAL:
    pcVar3 = "EQUAL: ";
    lVar1 = 7;
    break;
  default:
    poVar2 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unexpected value of token type",0x1e);
    goto LAB_00102402;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
LAB_00102402:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void dump_token(const SToken& t)
{
    switch (t.type)
    {
        case LEFT_BRACE:
            std::cerr << "LEFT_BRACE: " << t.start << ", " << t.length << std::endl;
            break;
            
        case RIGHT_BRACE:
            std::cerr << "RIGHT_BRACE: " << t.start << ", " << t.length << std::endl;
            break;
            
        case BOOLEAN:
            std::cerr << "BOOLEAN: " << t.start << ", " << t.length << std::endl;
            break;
            
        case NUMBER:
            std::cerr << "NUMBER: " << t.start << ", " << t.length << std::endl;
            break;
            
        case STRING:
            std::cerr << "STRING: " << t.start << ", " << t.length << std::endl;
            break;
            
        case SEPARATOR:
            std::cerr << "SEPARATOR: " << t.start << ", " << t.length << std::endl;
            break;
            
        case EQUAL:
            std::cerr << "EQUAL: " << t.start << ", " << t.length << std::endl;
            break;
            
        default:
            std::cerr << "Unexpected value of token type" << std::endl;
    }
}